

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

void Saig_SynchInitRegsTernary(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar3 = uVar2;
  }
  while (iVar4 = (int)uVar2, iVar4 < pAig->nRegs) {
    pvVar1 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar4);
    pvVar1 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar1 + 0x24));
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)pvVar1 + uVar2 * 4) = 0xffffffff;
    }
    uVar2 = (ulong)(iVar4 + 1);
  }
  return;
}

Assistant:

void Saig_SynchInitRegsTernary( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = 0xffffffff;
    }
}